

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jobs.cpp
# Opt level: O3

bool __thiscall JsUtil::JobProcessor::RemoveJob(JobProcessor *this,Job *job)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JobManager *pJVar4;
  uint uVar5;
  
  if (job == (Job *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                       ,0x144,"(job)","job");
    if (!bVar2) goto LAB_0067ad14;
    *puVar3 = 0;
  }
  bVar2 = DoublyLinkedListElement<JsUtil::JobManager,_Memory::ArenaAllocator>::
          Contains<JsUtil::JobManager>(job->manager,(this->managers).head);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                       ,0x145,"(managers.Contains(job->Manager()))",
                       "managers.Contains(job->Manager())");
    if (!bVar2) goto LAB_0067ad14;
    *puVar3 = 0;
  }
  if (this->isClosed == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                       ,0x146,"(!IsClosed())","!IsClosed()");
    if (!bVar2) goto LAB_0067ad14;
    *puVar3 = 0;
  }
  DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>::UnlinkPartial<JsUtil::Job>
            (job,&(this->jobs).head,&(this->jobs).tail);
  (job->super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>).previous = (Type)0x0;
  (job->super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>).next = (Type)0x0;
  pJVar4 = job->manager;
  uVar5 = pJVar4->numJobsAddedToProcessor;
  if (uVar5 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                       ,0x149,"(job->Manager()->numJobsAddedToProcessor != 0)",
                       "job->Manager()->numJobsAddedToProcessor != 0");
    if (!bVar2) {
LAB_0067ad14:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pJVar4 = job->manager;
    uVar5 = pJVar4->numJobsAddedToProcessor;
  }
  pJVar4->numJobsAddedToProcessor = uVar5 - 1;
  return true;
}

Assistant:

bool JobProcessor::RemoveJob(Job *const job)
    {
        // This function is called from inside the lock

        Assert(job);
        Assert(managers.Contains(job->Manager()));
        Assert(!IsClosed());

        jobs.Unlink(job);
        Assert(job->Manager()->numJobsAddedToProcessor != 0);
        --job->Manager()->numJobsAddedToProcessor;
        return true;
    }